

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall
QToolBarAreaLayoutInfo::moveToolBar(QToolBarAreaLayoutInfo *this,QToolBar *toolbar,int pos)

{
  Orientation OVar1;
  Representation RVar2;
  bool bVar3;
  int iVar4;
  pointer pQVar5;
  QList<QToolBarAreaLayoutItem> *this_00;
  pointer pQVar6;
  QToolBar *pQVar7;
  QSize QVar8;
  pointer pQVar9;
  QSize QVar10;
  long lVar11;
  QToolBarAreaLayoutItem *this_01;
  int iVar12;
  long lVar13;
  int iVar14;
  QToolBarAreaLayoutItem *this_02;
  int iVar15;
  int l;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  QToolBarAreaLayoutItem *pQVar20;
  uint local_64;
  ulong local_60;
  
  if (this->dirty == true) {
    fitLayout(this);
  }
  this->dirty = true;
  uVar19 = 0;
  iVar16 = 0;
  if (this->o == Vertical) {
    iVar16 = (this->rect).y1.m_i;
  }
  iVar16 = pos - iVar16;
  do {
    if ((ulong)(this->lines).d.size <= uVar19) {
      return;
    }
    pQVar5 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
    this_00 = &pQVar5[uVar19].toolBarItems;
    lVar13 = 0;
    iVar14 = 0;
    local_64 = 0xffffffff;
    for (uVar18 = 0; uVar18 < (ulong)pQVar5[uVar19].toolBarItems.d.size; uVar18 = uVar18 + 1) {
      pQVar6 = QList<QToolBarAreaLayoutItem>::data(this_00);
      pQVar20 = (QToolBarAreaLayoutItem *)((long)&pQVar6->widgetItem + lVar13);
      pQVar7 = (QToolBar *)(**(code **)(**(long **)((long)&pQVar6->widgetItem + lVar13) + 0x68))();
      if (pQVar7 == toolbar) {
        if ((int)local_64 < 0) {
          return;
        }
        pQVar9 = QList<QToolBarAreaLayoutItem>::data(this_00);
        this_01 = pQVar9 + local_64;
        iVar12 = *(int *)((long)&pQVar6->pos + lVar13);
        if (iVar16 < iVar12) {
          if (iVar14 < iVar16) {
            iVar14 = iVar16;
          }
        }
        else {
          OVar1 = this->o;
          QVar10 = QRect::size(&this->rect);
          QVar8 = (QSize)((ulong)QVar10 >> 0x20);
          if (OVar1 == Horizontal) {
            QVar8 = QVar10;
          }
          local_60 = (ulong)QVar8 & 0xffffffff;
          lVar11 = lVar13;
          for (; iVar14 = (int)local_60, uVar18 < (ulong)pQVar5[uVar19].toolBarItems.d.size;
              uVar18 = uVar18 + 1) {
            this_02 = (QToolBarAreaLayoutItem *)
                      ((long)&(pQVar5[uVar19].toolBarItems.d.ptr)->widgetItem + lVar11);
            bVar3 = QToolBarAreaLayoutItem::skip(this_02);
            if (!bVar3) {
              OVar1 = this->o;
              QVar10 = QToolBarAreaLayoutItem::minimumSize(this_02);
              QVar8 = (QSize)((ulong)QVar10 >> 0x20);
              if (OVar1 == Horizontal) {
                QVar8 = QVar10;
              }
              local_60 = (ulong)(uint)(iVar14 - QVar8.wd.m_i);
            }
            lVar11 = lVar11 + 0x18;
          }
          if (iVar16 < iVar14) {
            iVar14 = iVar16;
          }
          iVar12 = *(int *)((long)&pQVar6->pos + lVar13);
        }
        OVar1 = this->o;
        QVar10 = QToolBarAreaLayoutItem::sizeHint(this_01);
        QVar8 = (QSize)((ulong)QVar10 >> 0x20);
        if (OVar1 == Horizontal) {
          QVar8 = QVar10;
        }
        iVar17 = QVar8.wd.m_i.m_i - (this_01->size + (iVar14 - iVar12));
        iVar16 = -iVar17;
        if (0 < iVar17) {
          iVar16 = iVar17;
        }
        iVar4 = QApplication::startDragDistance();
        iVar15 = 0;
        if (iVar16 < iVar4) {
          iVar15 = iVar17;
        }
        iVar15 = iVar15 + (iVar14 - iVar12);
        iVar16 = -iVar15;
        QToolBarAreaLayoutItem::extendSize(pQVar20,pQVar5[uVar19].o,iVar16);
        if (iVar15 < 0) {
          for (; -1 < (int)local_64; local_64 = local_64 - 1) {
            pQVar6 = QList<QToolBarAreaLayoutItem>::data(this_00);
            pQVar20 = pQVar6 + local_64;
            bVar3 = QToolBarAreaLayoutItem::skip(pQVar20);
            if (!bVar3) {
              OVar1 = this->o;
              QVar10 = QToolBarAreaLayoutItem::minimumSize(pQVar20);
              QVar8 = (QSize)((ulong)QVar10 >> 0x20);
              if (OVar1 == Horizontal) {
                QVar8 = QVar10;
              }
              iVar14 = pQVar20->size - QVar8.wd.m_i;
              iVar12 = iVar16 - iVar14;
              if (iVar12 == 0 || iVar16 < iVar14) {
                QToolBarAreaLayoutItem::extendSize(pQVar20,pQVar5[uVar19].o,-iVar16);
                iVar16 = 0;
              }
              else {
                QToolBarAreaLayoutItem::resize(pQVar20,pQVar5[uVar19].o,QVar8.wd.m_i.m_i);
                iVar16 = iVar12;
              }
            }
          }
          return;
        }
        QToolBarAreaLayoutItem::extendSize(this_01,pQVar5[uVar19].o,iVar15);
        return;
      }
      bVar3 = QToolBarAreaLayoutItem::skip(pQVar20);
      if (!bVar3) {
        OVar1 = this->o;
        QVar8 = QToolBarAreaLayoutItem::minimumSize(pQVar20);
        RVar2 = QVar8.ht.m_i;
        if (OVar1 == Horizontal) {
          RVar2 = QVar8.wd.m_i;
        }
        iVar14 = iVar14 + RVar2.m_i;
        local_64 = (uint)uVar18;
      }
      lVar13 = lVar13 + 0x18;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void QToolBarAreaLayoutInfo::moveToolBar(QToolBar *toolbar, int pos)
{
    if (dirty)
        fitLayout();

    dirty = true;

    if (o == Qt::Vertical)
        pos -= rect.top();

    //here we actually update the preferredSize for the line containing the toolbar so that we move it
    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        int previousIndex = -1;
        int minPos = 0;
        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            QToolBarAreaLayoutItem &current = line.toolBarItems[k];
            if (current.widgetItem->widget() == toolbar) {
                int newPos = current.pos;

                if (previousIndex >= 0) {
                    QToolBarAreaLayoutItem &previous = line.toolBarItems[previousIndex];
                    if (pos < current.pos) {
                        newPos = qMax(pos, minPos);
                    } else {
                        //we check the max value for the position (until everything at the right is "compressed")
                        int maxPos = pick(o, rect.size());
                        for(int l = k; l < line.toolBarItems.size(); ++l) {
                            const QToolBarAreaLayoutItem &item = line.toolBarItems.at(l);
                            if (!item.skip()) {
                                maxPos -= pick(o, item.minimumSize());
                            }
                        }
                        newPos = qMin(pos, maxPos);
                    }

                    //extra is the number of pixels to add to the previous toolbar
                    int extra = newPos - current.pos;

                    //we check if the previous is near its size hint
                    //in which case we try to stick to it
                    const int diff = pick(o, previous.sizeHint()) - (previous.size + extra);
                    if (qAbs(diff) < QApplication::startDragDistance()) {
                        //we stick to the default place and size
                        extra += diff;
                    }

                    //update for the current item
                    current.extendSize(line.o, -extra);

                    if (extra >= 0) {
                        previous.extendSize(line.o, extra);
                    } else {
                        //we need to push the toolbars on the left starting with previous
                        extra = -extra; // we just need to know the number of pixels
                        ///at this point we need to get extra pixels from the toolbars at the left
                        for(int l = previousIndex; l >=0; --l) {
                            QToolBarAreaLayoutItem &item = line.toolBarItems[l];
                            if (!item.skip()) {
                                const int minPreferredSize = pick(o, item.minimumSize());
                                const int margin =  item.size - minPreferredSize;
                                if (margin < extra) {
                                    item.resize(line.o, minPreferredSize);
                                    extra -= margin;
                                } else {
                                    item.extendSize(line.o, -extra);
                                    extra = 0;
                                }
                            }
                        }
                        Q_ASSERT(extra == 0);
                    }
                } else {
                    //the item is the first one, it should be at position 0
                }

                return;

            } else if (!current.skip()) {
                previousIndex = k;
                minPos += pick(o, current.minimumSize());
            }
        }
    }
}